

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  TestCaseData *pTVar1;
  ostream *poVar2;
  ulong uVar3;
  String *pSVar4;
  char *pcVar5;
  long lVar6;
  TestCaseData *pTVar7;
  int iVar8;
  bool bVar9;
  
  std::mutex::lock(&this->mutex);
  if (this->tc->m_no_output == false) {
    logTestStart(this);
    pTVar1 = this->tc;
    pTVar7 = pTVar1;
    if ((pTVar1->m_file).field_0.buf[0x17] < '\0') {
      pTVar7 = (TestCaseData *)(pTVar1->m_file).field_0.data.ptr;
    }
    pcVar5 = " ";
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar7,(ulong)pTVar1->m_line);
    successOrFailColoredStringToStream(this,false,(uint)e->is_crash * 2 + is_check,pcVar5);
    poVar2 = this->s;
    Color::operator<<(poVar2,Red);
    pcVar5 = "test case THREW exception: ";
    if (e->is_crash != false) {
      pcVar5 = "test case CRASHED: ";
    }
    poVar2 = std::operator<<(poVar2,pcVar5);
    Color::operator<<(poVar2,Cyan);
    poVar2 = doctest::operator<<(poVar2,&e->error_string);
    std::operator<<(poVar2,"\n");
    uVar3 = (*(long *)(detail::g_cs + 0x1100) - *(long *)(detail::g_cs + 0x10f8)) / 0x18;
    iVar8 = (int)uVar3;
    if (iVar8 != 0) {
      pSVar4 = IReporter::get_stringified_contexts();
      poVar2 = this->s;
      Color::operator<<(poVar2,None);
      std::operator<<(poVar2,"  logged: ");
      pSVar4 = pSVar4 + (uVar3 & 0xffffffff);
      lVar6 = 0;
      while (pSVar4 = pSVar4 + -1, 0 < iVar8 + (int)lVar6) {
        bVar9 = lVar6 == 0;
        lVar6 = lVar6 + -1;
        pcVar5 = "          ";
        if (bVar9) {
          pcVar5 = "";
        }
        poVar2 = std::operator<<(this->s,pcVar5);
        poVar2 = doctest::operator<<(poVar2,pSVar4);
        std::operator<<(poVar2,"\n");
      }
    }
    poVar2 = std::operator<<(this->s,"\n");
    Color::operator<<(poVar2,None);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            DOCTEST_LOCK_MUTEX(mutex)
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }